

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptStringObject * __thiscall
Js::JavascriptLibrary::CreateStringObject(JavascriptLibrary *this,JavascriptString *value)

{
  code *pcVar1;
  JavascriptString *value_00;
  bool bVar2;
  DynamicType **ppDVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  JavascriptStringObject *this_00;
  TrackAllocData local_40;
  JavascriptString *local_18;
  JavascriptString *value_local;
  JavascriptLibrary *this_local;
  
  local_18 = value;
  value_local = (JavascriptString *)this;
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->stringTypeDynamic);
  if (*ppDVar3 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1b90,"(stringTypeDynamic)","Where\'s stringTypeDynamic?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&JavascriptStringObject::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1b91);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_40);
  this_00 = (JavascriptStringObject *)new<Memory::Recycler>(0x28,pRVar5,0x43c4b0);
  value_00 = local_18;
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->stringTypeDynamic);
  JavascriptStringObject::JavascriptStringObject(this_00,value_00,*ppDVar3);
  return this_00;
}

Assistant:

JavascriptStringObject* JavascriptLibrary::CreateStringObject(JavascriptString* value)
    {
        AssertMsg(stringTypeDynamic, "Where's stringTypeDynamic?");
        return RecyclerNew(this->GetRecycler(), JavascriptStringObject, value, stringTypeDynamic);
    }